

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

_Bool fnet_socket_sendto(fnet_socket_t sock,char *buf,size_t len,fnet_address_t *addr)

{
  ssize_t sVar1;
  sockaddr *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int res;
  undefined1 local_1;
  
  if (in_RSI == (void *)0x0) {
    local_1 = false;
  }
  else {
    sVar1 = sendto(in_EDI,in_RSI,in_RDX,0,in_RCX,0x80);
    if ((int)sVar1 == -1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool fnet_socket_sendto(fnet_socket_t sock, const char *buf, size_t len, fnet_address_t const *addr)
{
    if (!buf)
    {
        FLOG_ERR("Invalid buffer");
        return false;
    }

    int res = sendto(sock, buf, len, 0, (const struct sockaddr *)addr, sizeof *addr);
    if (res == -1)
    {
        FLOG_ERR("Unable to send data");
        return false;
    }

    return true;
}